

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O0

iterator __thiscall
nestl::impl::detail::
rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
::erase(rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
        *this,const_iterator position)

{
  iterator iVar1;
  rb_tree_const_iterator<void_*> local_28;
  const_iterator result;
  rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
  *this_local;
  const_iterator position_local;
  
  local_28.m_node = position.m_node;
  result.m_node = (base_ptr)this;
  rb_tree_const_iterator<void_*>::operator++(&local_28);
  m_erase_aux(this,position);
  iVar1 = rb_tree_const_iterator<void_*>::m_const_cast(&local_28);
  return (iterator)iVar1.m_node;
}

Assistant:

iterator
    erase(const_iterator position) NESTL_NOEXCEPT_SPEC
    {
        const_iterator result = position;
        ++result;
        m_erase_aux(position);
        return result.m_const_cast();
    }